

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ushort uVar1;
  int iVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  unsigned_short *__src;
  ImVec2 IVar5;
  int iVar6;
  uint uVar7;
  ImDrawVert *pIVar8;
  ulong uVar9;
  unsigned_short *__dest;
  ulong uVar10;
  int rhs_size;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ImDrawVert *local_60;
  
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  iVar6 = this->CmdListsCount;
  if (0 < iVar6) {
    iVar2 = 0;
    local_60 = (ImDrawVert *)0x0;
    uVar12 = 0;
    lVar13 = 0;
    do {
      pIVar3 = this->CmdLists[lVar13];
      uVar11 = (pIVar3->IdxBuffer).Size;
      if (uVar11 != 0) {
        uVar7 = uVar11;
        if ((int)uVar12 < (int)uVar11) {
          if (uVar12 == 0) {
            uVar12 = 8;
          }
          else {
            uVar12 = uVar12 + (int)uVar12 / 2;
          }
          if ((int)uVar12 <= (int)uVar11) {
            uVar12 = uVar11;
          }
          pIVar8 = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar12 * 0x14);
          if (local_60 != (ImDrawVert *)0x0) {
            memcpy(pIVar8,local_60,(long)iVar2 * 0x14);
            ImGui::MemFree(local_60);
          }
          local_60 = pIVar8;
          uVar7 = (pIVar3->IdxBuffer).Size;
        }
        if (0 < (int)uVar7) {
          uVar9 = 0;
          if (0 < (int)uVar11) {
            uVar9 = (ulong)uVar11;
          }
          uVar10 = 0;
          pIVar8 = local_60;
          do {
            uVar1 = (pIVar3->IdxBuffer).Data[uVar10];
            if (((pIVar3->VtxBuffer).Size <= (int)(uint)uVar1) || (uVar9 == uVar10)) {
              __assert_fail("i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                            ,0x4e6,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar4 = (pIVar3->VtxBuffer).Data;
            pIVar8->col = pIVar4[uVar1].col;
            pIVar4 = pIVar4 + uVar1;
            IVar5 = pIVar4->uv;
            pIVar8->pos = pIVar4->pos;
            pIVar8->uv = IVar5;
            uVar10 = uVar10 + 1;
            pIVar8 = pIVar8 + 1;
          } while ((long)uVar10 < (long)(pIVar3->IdxBuffer).Size);
        }
        iVar2 = (pIVar3->VtxBuffer).Size;
        (pIVar3->VtxBuffer).Size = uVar11;
        uVar7 = (pIVar3->VtxBuffer).Capacity;
        (pIVar3->VtxBuffer).Capacity = uVar12;
        pIVar8 = (pIVar3->VtxBuffer).Data;
        (pIVar3->VtxBuffer).Data = local_60;
        if ((pIVar3->IdxBuffer).Capacity < 0) {
          __dest = (unsigned_short *)ImGui::MemAlloc(0);
          __src = (pIVar3->IdxBuffer).Data;
          if (__src != (unsigned_short *)0x0) {
            memcpy(__dest,__src,(long)(pIVar3->IdxBuffer).Size * 2);
            ImGui::MemFree((pIVar3->IdxBuffer).Data);
          }
          (pIVar3->IdxBuffer).Data = __dest;
          (pIVar3->IdxBuffer).Capacity = 0;
          uVar11 = (pIVar3->VtxBuffer).Size;
        }
        (pIVar3->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + uVar11;
        iVar6 = this->CmdListsCount;
        uVar12 = uVar7;
        local_60 = pIVar8;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar6);
    if (local_60 != (ImDrawVert *)0x0) {
      ImGui::MemFree(local_60);
    }
  }
  return;
}

Assistant:

static inline bool CanMergeDrawCommands(ImDrawCmd* a, ImDrawCmd* b)
{
    return memcmp(&a->ClipRect, &b->ClipRect, sizeof(a->ClipRect)) == 0 && a->TextureId == b->TextureId && a->VtxOffset == b->VtxOffset && !a->UserCallback && !b->UserCallback;
}